

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_open.c
# Opt level: O1

int mpt_connection_open(mpt_connection *con,char *to,mpt_fdmode *mp)

{
  bool bVar1;
  uint uVar2;
  int flg;
  int iVar3;
  ulong uVar4;
  mpt_data_encoder_t p_Var5;
  mpt_data_decoder_t p_Var6;
  mpt_buffer *__dest;
  int iVar7;
  mpt_socket tmp;
  mpt_fdmode mode;
  mpt_stream s;
  mpt_socket local_d4;
  mpt_fdmode local_d0;
  mpt_stream local_c8;
  
  local_d4._id = -1;
  if (((con->out).state & 0x10) != 0) {
    return -4;
  }
  if (to == (char *)0x0) {
    return -1;
  }
  if (mp == (mpt_fdmode *)0x0) {
    mp = &local_d0;
    uVar2 = mpt_mode_parse(mp,to);
    uVar4 = (ulong)uVar2;
    if ((int)uVar2 < 0) {
      return uVar2;
    }
    local_d0.stream._0_1_ = (byte)local_d0.stream | 0x30;
  }
  else {
    uVar4 = 0;
  }
  flg = mpt_connect(&local_d4,to + uVar4,mp);
  if (flg < 0) {
    return -2;
  }
  iVar3 = mpt_stream_sockflags(flg);
  if (iVar3 < 0) {
    __dest = (mpt_buffer *)0x0;
    goto LAB_001053aa;
  }
  memset(&local_c8,0,0x98);
  local_c8._rd._state.data.msg = -1;
  p_Var5 = (mpt_data_encoder_t)mpt_message_encoder(2);
  iVar7 = -8;
  iVar3 = -8;
  if ((p_Var5 == (mpt_data_encoder_t)0x0) ||
     (p_Var6 = (mpt_data_decoder_t)mpt_message_decoder(2), p_Var6 == (mpt_data_decoder_t)0x0)) {
LAB_001053a4:
    iVar7 = iVar3;
    __dest = (mpt_buffer *)0x0;
    bVar1 = false;
  }
  else {
    iVar3 = mpt_stream_dopen(&local_c8,&local_d4,(uint)mp->stream);
    if (iVar3 < 0) {
      close(local_d4._id);
LAB_0010539b:
      iVar3 = -4;
      goto LAB_001053a4;
    }
    local_c8._rd._dec = p_Var6;
    local_c8._wd._enc = p_Var5;
    __dest = (mpt_buffer *)malloc(0x98);
    if (__dest == (mpt_buffer *)0x0) goto LAB_0010539b;
    memcpy(__dest,&local_c8,0x98);
    bVar1 = true;
  }
  if (!bVar1) {
    return iVar7;
  }
LAB_001053aa:
  mpt_connection_close(con);
  if (__dest == (mpt_buffer *)0x0) {
    (con->out).sock._id = local_d4._id;
  }
  else {
    (con->out).buf._buf = __dest;
  }
  return flg;
}

Assistant:

extern int mpt_connection_open(MPT_STRUCT(connection) *con, const char *to, const MPT_STRUCT(fdmode) *mp)
{
	MPT_STRUCT(fdmode) mode;
	MPT_STRUCT(socket) tmp = MPT_SOCKET_INIT;
	MPT_STRUCT(stream) *srm = 0;
	int flg = 0, ret;
	
	if (con->out.state & MPT_OUTFLAG(Active)) {
		return MPT_ERROR(BadOperation);
	}
	if (!to) {
		return MPT_ERROR(BadArgument);
	}
	/* get mode from target string */
	if (!mp) {
		if ((flg = mpt_mode_parse(&mode, to)) < 0) {
			return flg;
		}
		mode.stream |= MPT_STREAMFLAG(Buffer);
		mp = &mode;
	}
	/* create new connection */
	if ((ret = mpt_connect(&tmp, to+flg, mp)) < 0) {
		return MPT_ERROR(BadValue);
	}
	if ((flg = mpt_stream_sockflags(ret)) >= 0) {
		static const char encoding = MPT_ENUM(EncodingCobs);
		MPT_STRUCT(stream) s = MPT_STREAM_INIT;
		MPT_TYPE(data_encoder) enc;
		MPT_TYPE(data_decoder) dec;
		
		if (!(enc = mpt_message_encoder(encoding))
		    || !(dec = mpt_message_decoder(encoding))) {
			return MPT_ERROR(BadEncoding);
		}
		if (mpt_stream_dopen(&s, &tmp, mp->stream) < 0) {
			(void) close(tmp._id);
			return MPT_ERROR(BadOperation);
		}
		s._wd._enc = enc;
		s._rd._dec = dec;
		
		if (!(srm = malloc(sizeof(*srm)))) {
			return MPT_ERROR(BadOperation);
		}
		*srm = s;
	}
	/* close old connection */
	mpt_connection_close(con);
	
	/* set new connection parameters */
	if (srm) {
		con->out.buf._buf = (void *) srm;
	} else {
		con->out.sock = tmp;
	}
	return ret;
}